

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CY<std::complex<float>_>::CY
          (CY<std::complex<float>_> *this,int control,int target,int controlState)

{
  PauliY<std::complex<float>_> *pPVar1;
  
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_001358f8;
  pPVar1 = (PauliY<std::complex<float>_> *)operator_new(0x10);
  (pPVar1->super_QGate1<std::complex<float>_>).qubit_ = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                  ,0x21,
                  "qclab::qgates::QGate1<std::complex<float>>::QGate1(const int) [T = std::complex<float>]"
                 );
  }
  (pPVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_> =
       (QObject<std::complex<float>_>)&PTR_nbQubits_00134bc0;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliY<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliY<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliY<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliY<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliY<std::complex<float>_>_*,_false>._M_head_impl = pPVar1
  ;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CY.hpp"
                  ,0x2c,
                  "qclab::qgates::CY<std::complex<float>>::CY(const int, const int, const int) [T = std::complex<float>]"
                 );
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CY.hpp"
                ,0x2b,
                "qclab::qgates::CY<std::complex<float>>::CY(const int, const int, const int) [T = std::complex<float>]"
               );
}

Assistant:

CY( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliY< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }